

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_conductor.hpp
# Opt level: O0

void __thiscall RoughConductorBRDF::f(RoughConductorBRDF *this)

{
  vec3f *in_stack_000004f8;
  vec3f *in_stack_00000500;
  Color *in_stack_00000508;
  RoughConductorBRDF *in_stack_00000510;
  
  f(in_stack_00000510,in_stack_00000508,in_stack_00000500,in_stack_000004f8);
  return;
}

Assistant:

Color f(const Color& albedo, const vec3f& wo, const vec3f& wi) const override
	{
		vec3f wm = normalized(wo+wi); // microfacet normal
		float cos = dot(wm,wo);
		Color t1 = (eta*eta + k*k) * (cos*cos);
		Color r1 = (t1 - 2*eta*cos + 1) / (t1 + 2*eta*cos + 1);
		Color t2 = eta*eta + k*k;
		Color r2 = (t2 - 2*eta*cos + Color(cos*cos)) / (t2 + 2*eta*cos + Color(cos*cos));
		Color Fres = 0.5 * (r1 + r2); // reflected energy
		return EDX::GGX_D(wm,alpha) * EDX::Smith_G(wo,wi,wm,alpha) / (4 * wo.z * wi.z) * Fres * albedo;
	}